

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_avx2.c
# Opt level: O2

uint hbd_obmc_sad_w8n_avx2
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  lVar6 = (long)pre8 * 2;
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  lVar5 = 0;
  auVar9._8_4_ = 0x800;
  auVar9._0_8_ = 0x80000000800;
  auVar9._12_4_ = 0x800;
  auVar9._16_4_ = 0x800;
  auVar9._20_4_ = 0x800;
  auVar9._24_4_ = 0x800;
  auVar9._28_4_ = 0x800;
  uVar7 = 0;
  do {
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(lVar6 + lVar5));
    auVar10 = vlddqu_avx(*(undefined1 (*) [32])mask);
    auVar2 = vlddqu_avx(*(undefined1 (*) [32])wsrc);
    uVar7 = uVar7 + 8;
    iVar4 = pre_stride - width;
    if ((int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) % (long)width)
        != 0) {
      iVar4 = 0;
    }
    auVar3 = vpmovzxwd_avx2(auVar1);
    auVar10 = vpmaddwd_avx2(auVar3,auVar10);
    auVar10 = vpsubd_avx2(auVar2,auVar10);
    auVar10 = vpabsd_avx2(auVar10);
    auVar10 = vpaddd_avx2(auVar10,auVar9);
    auVar10 = vpsrld_avx2(auVar10,0xc);
    auVar10 = vpaddd_avx2(auVar10,auVar8._0_32_);
    auVar8 = ZEXT3264(auVar10);
    lVar6 = lVar6 + (long)iVar4 * 2;
    wsrc = (int32_t *)((long)wsrc + 0x20);
    mask = (int32_t *)((long)mask + 0x20);
    lVar5 = lVar5 + 0x10;
  } while ((long)uVar7 < (long)(height * width));
  auVar1 = vpaddd_avx(auVar10._0_16_,auVar10._16_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  return auVar1._0_4_;
}

Assistant:

static inline unsigned int hbd_obmc_sad_w8n_avx2(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, const int width, const int height) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - width;
  int n = 0;
  __m256i v_sad_d = _mm256_setzero_si256();
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);

  assert(width >= 8);
  assert(IS_POWER_OF_TWO(width));

  do {
    const __m128i v_p0_w = _mm_lddqu_si128((__m128i *)(pre + n));
    const __m256i v_m0_d = _mm256_lddqu_si256((__m256i *)(mask + n));
    const __m256i v_w0_d = _mm256_lddqu_si256((__m256i *)(wsrc + n));

    const __m256i v_p0_d = _mm256_cvtepu16_epi32(v_p0_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m256i v_pm0_d = _mm256_madd_epi16(v_p0_d, v_m0_d);

    const __m256i v_diff0_d = _mm256_sub_epi32(v_w0_d, v_pm0_d);
    const __m256i v_absdiff0_d = _mm256_abs_epi32(v_diff0_d);

    // Rounded absolute difference
    const __m256i v_tmp_d = _mm256_add_epi32(v_absdiff0_d, v_bias_d);
    const __m256i v_rad0_d = _mm256_srli_epi32(v_tmp_d, 12);

    v_sad_d = _mm256_add_epi32(v_sad_d, v_rad0_d);

    n += 8;

    if (n % width == 0) pre += pre_step;
  } while (n < width * height);

  __m128i v_sad_d_0 = _mm256_castsi256_si128(v_sad_d);
  __m128i v_sad_d_1 = _mm256_extracti128_si256(v_sad_d, 1);
  v_sad_d_0 = _mm_add_epi32(v_sad_d_0, v_sad_d_1);
  return xx_hsum_epi32_si32(v_sad_d_0);
}